

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *out,double v)

{
  uchar b [8];
  
  b = (uchar  [8])v;
  std::ostream::write((char *)out,(long)b);
  return;
}

Assistant:

void
write (T& out, double v)
{
    union
    {
        uint64_t i;
        double   d;
    } u;
    u.d = v;

    unsigned char b[8];

    b[0] = (unsigned char) (u.i);
    b[1] = (unsigned char) (u.i >> 8);
    b[2] = (unsigned char) (u.i >> 16);
    b[3] = (unsigned char) (u.i >> 24);
    b[4] = (unsigned char) (u.i >> 32);
    b[5] = (unsigned char) (u.i >> 40);
    b[6] = (unsigned char) (u.i >> 48);
    b[7] = (unsigned char) (u.i >> 56);

    writeUnsignedChars<S> (out, b, 8);
}